

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_enc.c
# Opt level: O2

int PreLoopInitialize(VP8Encoder *enc)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  VP8BitWriter *bw;
  
  bVar1 = "2\x18\x10\t\a\x05\x03\x02"[enc->base_quant >> 4];
  iVar5 = enc->mb_w;
  iVar2 = enc->mb_h;
  iVar3 = enc->num_parts;
  bw = enc->parts;
  iVar4 = 1;
  lVar6 = 0;
  while( true ) {
    if (iVar4 == 0) {
      VP8EncFreeBitWriters(enc);
      iVar5 = WebPEncodingSetError(enc->pic,VP8_ENC_ERROR_OUT_OF_MEMORY);
      return iVar5;
    }
    if (enc->num_parts <= lVar6) break;
    iVar4 = VP8BitWriterInit(bw,(long)((int)((uint)bVar1 * iVar5 * iVar2) / iVar3));
    lVar6 = lVar6 + 1;
    bw = bw + 1;
  }
  return iVar4;
}

Assistant:

static int PreLoopInitialize(VP8Encoder* const enc) {
  int p;
  int ok = 1;
  const int average_bytes_per_MB = kAverageBytesPerMB[enc->base_quant >> 4];
  const int bytes_per_parts =
      enc->mb_w * enc->mb_h * average_bytes_per_MB / enc->num_parts;
  // Initialize the bit-writers
  for (p = 0; ok && p < enc->num_parts; ++p) {
    ok = VP8BitWriterInit(enc->parts + p, bytes_per_parts);
  }
  if (!ok) {
    VP8EncFreeBitWriters(enc);  // malloc error occurred
    return WebPEncodingSetError(enc->pic, VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  return ok;
}